

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall
CTcPrsOpOr::eval_constant(CTcPrsOpOr *this,CTcPrsNode *left,CTcPrsNode *right)

{
  int iVar1;
  CTcConstVal *this_00;
  CTcPrsNode *in_RDX;
  CTcPrsNode *in_RSI;
  CTcPrsNode *ret;
  CTcConstVal *in_stack_ffffffffffffffc0;
  CTcPrsNode *local_28;
  CTcPrsNode *local_8;
  undefined4 extraout_var;
  
  iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x2a4cbd);
  if (iVar1 == 0) {
    local_8 = (CTcPrsNode *)0x0;
  }
  else {
    (*(in_RSI->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
    iVar1 = CTcConstVal::get_val_bool(in_stack_ffffffffffffffc0);
    local_28 = in_RDX;
    if (iVar1 != 0) {
      local_28 = in_RSI;
    }
    iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x2a4cfe);
    if (iVar1 == 0) {
      local_28 = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x2a4d3e);
      CTPNBoolize::CTPNBoolize((CTPNBoolize *)in_stack_ffffffffffffffc0,local_28);
    }
    else {
      iVar1 = (*(local_28->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
      this_00 = (CTcConstVal *)CONCAT44(extraout_var,iVar1);
      (*(local_28->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
      iVar1 = CTcConstVal::get_val_bool(this_00);
      CTcConstVal::set_bool(this_00,iVar1);
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

CTcPrsNode *CTcPrsOpOr::eval_constant(CTcPrsNode *left,
                                      CTcPrsNode *right) const
{
    /* check for constants */
    if (left->is_const())
    {
        CTcPrsNode *ret;
        
        /* 
         *   Check for constants.  If the first expression is constant,
         *   the result will always be either 'true' (if the first
         *   expression's constant value is true), or the value of the
         *   second expression (if the first expression's constant value
         *   is 'nil').
         *   
         *   Note that it doesn't matter whether or not the right side is
         *   a constant.  If the left is true, the right will never be
         *   executed because of the short-circuit logic; if the left is
         *   nil, the result will always be the result of the right value.
         */
        if (left->get_const_val()->get_val_bool())
        {
            /* 
             *   the left is true, so the result is always true, and the
             *   right never gets executed 
             */
            ret = left;
        }
        else
        {
            /* the left is nil, so the result is the right value */
            ret = right;
        }

        /* ensure the result is a boolean value */
        if (ret->is_const())
        {
            /* make it a true/nil constant value */
            ret->get_const_val()
                ->set_bool(ret->get_const_val()->get_val_bool());
        }
        else
        {
            /* boolean-ize the value at run-time as needed */
            ret = new CTPNBoolize(ret);
        }

        /* return the result */
        return ret;
    }
    else
    {
        /* 
         *   one or the other is non-constant, so we can't fold the
         *   expression - return null to so indicate 
         */
        return 0;
    }
}